

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Node * __thiscall
google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::CloneFromOther
          (Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *this,
          Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *other)

{
  ForeignMessage *this_00;
  Node *pNVar1;
  Node *pNVar2;
  uint uVar3;
  ulong uVar4;
  Node *pNVar5;
  
  uVar3 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar4 = (ulong)uVar3;
  if (uVar3 == (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    return (Node *)0x0;
  }
  pNVar2 = (Node *)(other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar4];
  if (pNVar2 != (Node *)0x0) {
    pNVar5 = (Node *)0x0;
    do {
      do {
        pNVar1 = (Node *)protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
        (pNVar1->kv).first = (pNVar2->kv).first;
        (pNVar1->kv).second.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             (intptr_t)(this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.arena_;
        (pNVar1->kv).second.super_Message.super_MessageLite._vptr_MessageLite =
             (_func_int **)&PTR__ForeignMessage_01905010;
        *(undefined8 *)&(pNVar1->kv).second.field_0 = 0;
        (pNVar1->kv).second.field_0._impl_.c_ = 0;
        if (pNVar2 != pNVar1) {
          this_00 = &(pNVar1->kv).second;
          proto2_nofieldpresence_unittest::ForeignMessage::Clear(this_00);
          proto2_nofieldpresence_unittest::ForeignMessage::MergeImpl
                    ((MessageLite *)this_00,(MessageLite *)&(pNVar2->kv).second);
        }
        (pNVar1->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar5;
        pNVar2 = (Node *)(pNVar2->super_KeyNode).super_NodeBase.next;
        pNVar5 = pNVar1;
      } while (pNVar2 != (Node *)0x0);
      do {
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        if ((other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar3) {
          return pNVar1;
        }
        pNVar2 = (Node *)(other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar3];
      } while (pNVar2 == (Node *)0x0);
    } while( true );
  }
  protobuf::internal::protobuf_assumption_failed
            ("node != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x22e);
}

Assistant:

inline UntypedMapIterator UntypedMapBase::begin() const {
  map_index_t bucket_index;
  NodeBase* node;
  if (index_of_first_non_null_ == num_buckets_) {
    bucket_index = 0;
    node = nullptr;
  } else {
    bucket_index = index_of_first_non_null_;
    node = table_[bucket_index];
    PROTOBUF_ASSUME(node != nullptr);
  }
  return UntypedMapIterator{node, this, bucket_index};
}